

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

void __thiscall
capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f0sp(Builder *this,Reader value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)((long)(this->_builder).data + 2) = 0xb;
  local_18.pointer = (this->_builder).pointers + 1;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  ::capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_18,value);
  return;
}

Assistant:

inline void TestUnion::Union1::Builder::setU1f0sp( ::capnp::Text::Reader value) {
  _builder.setDataField<TestUnion::Union1::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, TestUnion::Union1::U1F0SP);
  ::capnp::_::PointerHelpers< ::capnp::Text>::set(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS), value);
}